

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O2

void gamma_transform_test
               (png_modifier *pm,png_byte colour_type,png_byte bit_depth,int palette_number,
               int interlace_type,double file_gamma,double screen_gamma,png_byte sbit,
               int use_input_precision,int scale16)

{
  size_t sVar1;
  char *cat;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined7 in_register_00000089;
  undefined4 in_stack_ffffffffffffff44;
  char name [64];
  
  uVar3 = (undefined4)CONCAT71(in_register_00000089,sbit);
  uVar2 = SUB84(pm,0);
  if (interlace_type == 0 || (png_byte)interlace_type == colour_type) {
    cat = "gamma ";
    sVar1 = 0;
  }
  else {
    sVar1 = safecat(name,0x40,0,"sbit(");
    sVar1 = safecatn(name,0x40,sVar1,interlace_type & 0xffU);
    cat = ") ";
  }
  sVar1 = safecat(name,0x40,sVar1,cat);
  if (use_input_precision != 0) {
    sVar1 = safecat(name,0x40,sVar1,"16to8 ");
  }
  sVar1 = safecatd(name,0x40,sVar1,file_gamma,3);
  sVar1 = safecat(name,0x40,sVar1,"->");
  safecatd(name,0x40,sVar1,screen_gamma,3);
  gamma_test((png_modifier *)(ulong)(byte)uVar2,colour_type,bit_depth,palette_number,
             interlace_type & 0xffU,file_gamma,screen_gamma,'\0',(int)name,
             (char *)CONCAT44(in_stack_ffffffffffffff44,uVar3),use_input_precision,
             (uint)::pm._1596_4_ >> 0x18 & 1,0,0,(png_color_16 *)CONCAT44(uVar3,uVar2),0.0);
  return;
}

Assistant:

static void gamma_transform_test(png_modifier *pm,
   png_byte colour_type, png_byte bit_depth,
   int palette_number,
   int interlace_type, const double file_gamma,
   const double screen_gamma, png_byte sbit,
   int use_input_precision, int scale16)
{
   size_t pos = 0;
   char name[64];

   if (sbit != bit_depth && sbit != 0)
   {
      pos = safecat(name, sizeof name, pos, "sbit(");
      pos = safecatn(name, sizeof name, pos, sbit);
      pos = safecat(name, sizeof name, pos, ") ");
   }

   else
      pos = safecat(name, sizeof name, pos, "gamma ");

   if (scale16)
      pos = safecat(name, sizeof name, pos, "16to8 ");

   pos = safecatd(name, sizeof name, pos, file_gamma, 3);
   pos = safecat(name, sizeof name, pos, "->");
   pos = safecatd(name, sizeof name, pos, screen_gamma, 3);

   gamma_test(pm, colour_type, bit_depth, palette_number, interlace_type,
      file_gamma, screen_gamma, sbit, 0, name, use_input_precision,
      scale16, pm->test_gamma_expand16, 0 , 0, 0);
}